

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

int __thiscall rengine::Signal<>::connect(Signal<> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  Bucket *this_00;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *this_01;
  undefined4 in_register_00000034;
  Bucket *local_30;
  Bucket *local_28;
  Bucket *bucket;
  SignalHandler<> *handler_local;
  SignalEmitter *emitter_local;
  Signal<> *this_local;
  
  handler_local = (SignalHandler<> *)CONCAT44(in_register_00000034,__fd);
  bucket = (Bucket *)__addr;
  emitter_local = (SignalEmitter *)this;
  local_28 = findBucket(this,(SignalEmitter *)handler_local);
  if (local_28 == (Bucket *)0x0) {
    this_00 = (Bucket *)operator_new(0x28);
    memset(this_00,0,0x28);
    Bucket::Bucket(this_00);
    (this_00->super_BucketBase).signal = &this->super_SignalBase;
    local_28 = this_00;
    if (handler_local[1]._vptr_SignalHandler == (_func_int **)0x0) {
      this_01 = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                 *)operator_new(0x18);
      memset(this_01,0,0x18);
      std::
      vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
      ::vector(this_01);
      handler_local[1]._vptr_SignalHandler = (_func_int **)this_01;
    }
    local_30 = local_28;
    std::
    vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
    ::push_back((vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                 *)handler_local[1]._vptr_SignalHandler,(value_type *)&local_30);
  }
  std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::push_back
            (&local_28->handlers,(value_type *)&bucket);
  return extraout_EAX;
}

Assistant:

void connect(SignalEmitter *emitter, SignalHandler<Arguments ...> *handler)
    {
        Bucket *bucket = findBucket(emitter);
        if (!bucket) {
            bucket = new Bucket();
            bucket->signal = this;
            if (!emitter->m_buckets) {
                emitter->m_buckets = new std::vector<SignalEmitter::BucketBase *>();
            }
            emitter->m_buckets->push_back(bucket);
        }
        bucket->handlers.push_back(handler);
    }